

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O0

Person * __thiscall Controller::findPersonByName(Controller *this,string *name)

{
  bool bVar1;
  ostream *poVar2;
  reference ppPVar3;
  _Self local_48;
  _List_node_base *local_40;
  _List_node_base *local_38;
  _List_const_iterator<Person_*> local_30;
  _Self local_28;
  _List_const_iterator<Person_*> it;
  string *name_local;
  Controller *this_local;
  
  it._M_node = (_List_node_base *)name;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<Person_*,_std::allocator<Person_*>_>::begin(&this->players);
  local_38 = (_List_node_base *)
             std::__cxx11::list<Person_*,_std::allocator<Person_*>_>::end(&this->players);
  local_40 = it._M_node;
  local_28._M_node =
       (_List_node_base *)
       std::
       find_if<std::_List_const_iterator<Person*>,Controller::findPersonByName(std::__cxx11::string_const&)const::__0>
                 (local_30,(_List_const_iterator<Person_*>)local_38,it._M_node);
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::list<Person_*,_std::allocator<Person_*>_>::end(&this->players);
  bVar1 = std::operator==(&local_28,&local_48);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"La personne ");
    poVar2 = std::operator<<(poVar2,(string *)it._M_node);
    poVar2 = std::operator<<(poVar2," n\'existe pas");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local = (Controller *)0x0;
  }
  else {
    ppPVar3 = std::_List_const_iterator<Person_*>::operator*(&local_28);
    this_local = (Controller *)*ppPVar3;
  }
  return (Person *)this_local;
}

Assistant:

Person* Controller::findPersonByName(const string& name) const {
    // Searches in the list of persons
    auto it = std::find_if(players.begin(), players.end(),
               [&name](const Person* p) {return p->getName() == name;});
    if (it == players.end()) {
        cout << "La personne " << name << " n'existe pas" << endl;
        return nullptr;
    }
    return *it;
}